

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseField(Parser *this,StructDef *struct_def)

{
  undefined8 uVar1;
  Definition *pDVar2;
  BaseType BVar3;
  BaseType BVar4;
  bool bVar5;
  bool bVar6;
  Presence PVar7;
  StructDef *pSVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  Value *pVVar12;
  HashFunction p_Var13;
  HashFunction p_Var14;
  HashFunction p_Var15;
  EnumVal *pEVar16;
  undefined8 in_RDX;
  int t;
  bool local_f6f;
  bool local_f6a;
  byte local_f44;
  byte local_f43;
  bool local_f3f;
  byte local_f3b;
  byte local_f39;
  bool local_eed;
  byte local_eea;
  BaseType local_e68;
  bool local_d9e;
  bool local_d9a;
  StructDef *local_d90;
  bool local_d80;
  bool local_d7e;
  Value *val_1;
  bool done;
  voffset_t id;
  string *id_str;
  Value *attr;
  string local_c48 [39];
  allocator<char> local_c21;
  string local_c20;
  allocator<char> local_bf9;
  string local_bf8 [39];
  allocator<char> local_bd1;
  string local_bd0 [39];
  allocator<char> local_ba9;
  string local_ba8;
  Value *local_b88;
  Value *nested;
  string local_b78 [39];
  allocator<char> local_b51;
  string local_b50;
  allocator<char> local_b29;
  string local_b28 [39];
  allocator<char> local_b01;
  string local_b00;
  Value *local_ae0;
  Value *field_native_custom_alloc;
  string local_ad0 [39];
  allocator<char> local_aa9;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  Value *local_a60;
  Value *val;
  string local_a50;
  Value *local_a30;
  Value *cpp_ptr_type;
  string local_a20 [39];
  allocator<char> local_9f9;
  string local_9f8;
  Value *local_9d8;
  Value *cpp_type;
  string local_9c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  byte local_8c3;
  byte local_8c2;
  allocator<char> local_8c1;
  string local_8c0;
  allocator<char> local_899;
  string local_898 [39];
  allocator<char> local_871;
  string local_870 [39];
  allocator<char> local_849;
  string local_848 [39];
  allocator<char> local_821;
  string local_820 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_800;
  string *constant;
  string local_7f0 [39];
  allocator<char> local_7c9;
  string local_7c8 [39];
  allocator<char> local_7a1;
  string local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  byte local_73b;
  byte local_73a;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710 [32];
  Type local_6f0;
  Type local_6d0;
  bool local_6aa;
  allocator<char> local_6a9;
  string local_6a8 [6];
  bool is_valid;
  allocator<char> local_681;
  string local_680 [39];
  allocator<char> local_659;
  string local_658 [37];
  undefined1 local_633;
  bool local_632;
  allocator<char> local_631;
  undefined1 local_630 [5];
  bool optional;
  bool default_str_or_vec;
  byte local_60a;
  allocator<char> local_609;
  undefined1 local_608 [6];
  bool required;
  allocator<char> local_5e1;
  string local_5e0 [39];
  allocator<char> local_5b9;
  string local_5b8 [32];
  Type local_598;
  Type local_578;
  allocator<char> local_551;
  string local_550 [39];
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  Type local_4e0;
  BaseType local_4c0;
  allocator<char> local_4b9;
  BaseType element_base_type;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  allocator<char> local_3e1;
  string local_3e0;
  Value *local_3c0;
  Value *hash_name;
  string local_3b0;
  byte local_389;
  char *local_388;
  char *s;
  string *text;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [37];
  byte local_2fb;
  byte local_2fa;
  byte local_2f9;
  FieldDef *local_2f8;
  FieldDef *field;
  byte local_2c9;
  undefined1 local_2c8 [8];
  Type union_vector;
  string local_2a0 [32];
  Type local_280;
  byte local_259;
  undefined8 uStack_258;
  Type union_type;
  FieldDef *typefield;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [32];
  Type local_1b0;
  Type *local_190;
  Type *elem_type;
  undefined1 local_180 [6];
  bool valid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Type local_140;
  undefined1 local_120 [8];
  string type_name;
  undefined1 local_d8 [8];
  Type type;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dc;
  allocator<char> local_71;
  string local_70 [48];
  undefined1 local_40 [8];
  string name;
  StructDef *struct_def_local;
  Parser *this_local;
  CheckedError *ce;
  
  name.field_2._8_8_ = in_RDX;
  std::__cxx11::string::string
            ((string *)local_40,(string *)&(struct_def->super_Definition).file._M_string_length);
  pSVar8 = LookupCreateStruct((Parser *)struct_def,(string *)local_40,false,false);
  if (pSVar8 != (StructDef *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_70,"field name can not be the same as table/struct name",&local_71);
    Error(this,(string *)struct_def);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    goto LAB_0010eb73;
  }
  bVar5 = anon_unknown_0::IsLowerSnakeCase((string *)local_40);
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dc.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "field names should be lowercase snake_case, got: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    Warning((Parser *)struct_def,
            (string *)
            &dc.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &dc.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_b0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(struct_def->super_Definition).doc_comment.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  type._31_1_ = 0;
  t = (int)struct_def;
  Expect(this,t);
  bVar5 = CheckedError::Check((CheckedError *)this);
  if (bVar5) {
    type._31_1_ = 1;
  }
  if ((type._31_1_ & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (!bVar5) {
    type._30_1_ = 0;
    Expect(this,t);
    bVar5 = CheckedError::Check((CheckedError *)this);
    if (bVar5) {
      type._30_1_ = 1;
    }
    if ((type._30_1_ & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (!bVar5) {
      Type::Type((Type *)local_d8,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0,0);
      ParseType(this,(Type *)struct_def);
      bVar5 = CheckedError::Check((CheckedError *)this);
      if (!bVar5) {
        CheckedError::~CheckedError((CheckedError *)this);
        if ((*(byte *)(name.field_2._8_8_ + 0x110) & 1) == 0) {
LAB_0010ac9b:
          if (((*(byte *)(name.field_2._8_8_ + 0x110) & 1) == 0) &&
             (bVar5 = IsArray((Type *)local_d8), bVar5)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1f8,"fixed-length array in table must be wrapped in struct",&local_1f9)
            ;
            Error(this,(string *)struct_def);
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator(&local_1f9);
          }
          else {
            bVar5 = IsArray((Type *)local_d8);
            if (bVar5) {
              *(byte *)&struct_def[5].super_Definition.attributes.vec.
                        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(byte *)&struct_def[5].super_Definition.attributes.vec.
                             super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage | 1;
              bVar5 = SupportsAdvancedArrayFeatures((Parser *)struct_def);
              if (!bVar5) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (local_220,
                           "Arrays are not yet supported in all the specified programming languages."
                           ,(allocator<char> *)((long)&typefield + 7));
                Error(this,(string *)struct_def);
                std::__cxx11::string::~string(local_220);
                std::allocator<char>::~allocator((allocator<char> *)((long)&typefield + 7));
                goto LAB_0010eb57;
              }
            }
            uVar1 = name.field_2._8_8_;
            if (local_d8._0_4_ == BASE_TYPE_UNION) {
              union_type._0_8_ =
                   ((type.struct_def)->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent;
              union_type.struct_def =
                   (StructDef *)
                   ((type.struct_def)->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
              union_type.enum_def =
                   (EnumDef *)
                   ((type.struct_def)->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_right;
              uStack_258 = (FieldDef *)
                           CONCAT44((int)((ulong)*(undefined8 *)
                                                  &((type.struct_def)->fields).dict._M_t._M_impl.
                                                   super__Rb_tree_header._M_header >> 0x20),1);
              local_259 = 0;
              pcVar9 = UnionTypeFieldSuffix();
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_280,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_40,pcVar9);
              AddField(this,struct_def,(string *)uVar1,&local_280,(FieldDef **)&uStack_258);
              std::__cxx11::string::~string((string *)&local_280);
              bVar5 = CheckedError::Check((CheckedError *)this);
              if (bVar5) {
                local_259 = 1;
              }
              if ((local_259 & 1) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
joined_r0x0010b1f8:
              if (bVar5) goto LAB_0010eb57;
            }
            else {
              bVar5 = IsVector((Type *)local_d8);
              if ((bVar5) && (local_d8._4_4_ == BASE_TYPE_UNION)) {
                *(byte *)&struct_def[5].super_Definition.attributes.vec.
                          super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     *(byte *)&struct_def[5].super_Definition.attributes.vec.
                               super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage | 2;
                bVar5 = SupportsAdvancedUnionFeatures((Parser *)struct_def);
                if (!bVar5) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_2a0,
                             "Vectors of unions are not yet supported in at least one of the specified programming languages."
                             ,(allocator<char> *)&union_vector.field_0x1f);
                  Error(this,(string *)struct_def);
                  std::__cxx11::string::~string(local_2a0);
                  std::allocator<char>::~allocator((allocator<char> *)&union_vector.field_0x1f);
                  goto LAB_0010eb57;
                }
                Type::Type((Type *)local_2c8,BASE_TYPE_VECTOR,(StructDef *)0x0,
                           (EnumDef *)type.struct_def,0);
                uVar1 = name.field_2._8_8_;
                local_2c8._4_4_ = BASE_TYPE_UTYPE;
                local_2c9 = 0;
                pcVar9 = UnionTypeFieldSuffix();
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &field,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,pcVar9);
                AddField(this,struct_def,(string *)uVar1,(Type *)&field,(FieldDef **)local_2c8);
                std::__cxx11::string::~string((string *)&field);
                bVar5 = CheckedError::Check((CheckedError *)this);
                if (bVar5) {
                  local_2c9 = 1;
                }
                if ((local_2c9 & 1) == 0) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                goto joined_r0x0010b1f8;
              }
            }
            local_2f9 = 0;
            AddField(this,struct_def,(string *)name.field_2._8_8_,(Type *)local_40,
                     (FieldDef **)local_d8);
            bVar5 = CheckedError::Check((CheckedError *)this);
            if (bVar5) {
              local_2f9 = 1;
            }
            if ((local_2f9 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!bVar5) {
              if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x3d) {
                local_2fa = 0;
                Next(this);
                bVar5 = CheckedError::Check((CheckedError *)this);
                if (bVar5) {
                  local_2fa = 1;
                }
                if ((local_2fa & 1) == 0) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (!bVar5) {
                  local_2fb = 0;
                  ParseSingleValue(this,(string *)struct_def,(Value *)local_2f8,
                                   (bool)((char)local_2f8 + -0x38));
                  bVar5 = CheckedError::Check((CheckedError *)this);
                  if (bVar5) {
                    local_2fb = 1;
                  }
                  if ((local_2fb & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (!bVar5) {
                    bVar5 = IsStruct((Type *)local_d8);
                    if ((bVar5) ||
                       (((*(byte *)(name.field_2._8_8_ + 0x110) & 1) != 0 &&
                        (bVar5 = std::operator!=(&(local_2f8->value).constant,"0"), bVar5)))) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_320,
                                 "default values are not supported for struct fields, table fields, or in structs."
                                 ,&local_321);
                      Error(this,(string *)struct_def);
                      std::__cxx11::string::~string(local_320);
                      std::allocator<char>::~allocator(&local_321);
                    }
                    else {
                      bVar5 = IsString((Type *)local_d8);
                      if ((bVar5) || (bVar5 = IsVector((Type *)local_d8), bVar5)) {
                        *(byte *)&struct_def[5].super_Definition.attributes.vec.
                                  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             *(byte *)&struct_def[5].super_Definition.attributes.vec.
                                       super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage | 8;
                        bVar5 = std::operator!=(&(local_2f8->value).constant,"0");
                        if ((bVar5) &&
                           (bVar5 = SupportsDefaultVectorsAndStrings((Parser *)struct_def), !bVar5))
                        {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_348,
                                     "Default values for strings and vectors are not supported in one of the specified programming languages"
                                     ,&local_349);
                          Error(this,(string *)struct_def);
                          std::__cxx11::string::~string(local_348);
                          std::allocator<char>::~allocator(&local_349);
                          goto LAB_0010eb57;
                        }
                      }
                      bVar5 = IsVector((Type *)local_d8);
                      if (((!bVar5) ||
                          (bVar5 = std::operator!=(&(local_2f8->value).constant,"0"), !bVar5)) ||
                         (bVar5 = std::operator!=(&(local_2f8->value).constant,"[]"), !bVar5))
                      goto LAB_0010b7b7;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_370,"The only supported default for vectors is `[]`.",
                                 (allocator<char> *)((long)&text + 7));
                      Error(this,(string *)struct_def);
                      std::__cxx11::string::~string(local_370);
                      std::allocator<char>::~allocator((allocator<char> *)((long)&text + 7));
                    }
                  }
                }
              }
              else {
LAB_0010b7b7:
                bVar5 = IsFloat(local_d8._0_4_);
                if (bVar5) {
                  s = (char *)&(local_2f8->value).constant;
                  uVar10 = std::__cxx11::string::empty();
                  if ((uVar10 & 1) != 0) {
                    __assert_fail("false == text.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                                  ,0x3f1,"CheckedError flatbuffers::Parser::ParseField(StructDef &)"
                                 );
                  }
                  for (local_388 = (char *)std::__cxx11::string::c_str(); *local_388 == ' ';
                      local_388 = local_388 + 1) {
                  }
                  if ((*local_388 == '-') || (*local_388 == '+')) {
                    local_388 = local_388 + 1;
                  }
                  bVar5 = anon_unknown_0::IsIdentifierStart(*local_388);
                  if ((!bVar5) &&
                     (lVar11 = std::__cxx11::string::find_first_of
                                         ((char *)&(local_2f8->value).constant,0x1b5d87),
                     lVar11 == -1)) {
                    std::__cxx11::string::operator+=((string *)&(local_2f8->value).constant,".0");
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=(&(local_2f8->super_Definition).doc_comment,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_b0);
                local_389 = 0;
                ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)struct_def);
                bVar5 = CheckedError::Check((CheckedError *)this);
                if (bVar5) {
                  local_389 = 1;
                }
                if ((local_389 & 1) == 0) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (!bVar5) {
                  pDVar2 = &local_2f8->super_Definition;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3b0,"deprecated",
                             (allocator<char> *)((long)&hash_name + 7));
                  pVVar12 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar2->attributes,&local_3b0);
                  local_2f8->deprecated = pVVar12 != (Value *)0x0;
                  std::__cxx11::string::~string((string *)&local_3b0);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&hash_name + 7));
                  pDVar2 = &local_2f8->super_Definition;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3e0,"hash",&local_3e1);
                  pVVar12 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar2->attributes,&local_3e0);
                  std::__cxx11::string::~string((string *)&local_3e0);
                  std::allocator<char>::~allocator(&local_3e1);
                  local_3c0 = pVVar12;
                  if (pVVar12 == (Value *)0x0) {
LAB_0010be5d:
                    pDVar2 = &local_2f8->super_Definition;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_490,"vector64",&local_491);
                    pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                        (&pDVar2->attributes,&local_490);
                    std::__cxx11::string::~string((string *)&local_490);
                    std::allocator<char>::~allocator(&local_491);
                    if (pVVar12 != (Value *)0x0) {
                      bVar5 = IsVector((Type *)local_d8);
                      if (!bVar5) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&element_base_type,
                                   "`vector64` attribute can only be applied on vectors.",&local_4b9
                                  );
                        Error(this,(string *)struct_def);
                        std::__cxx11::string::~string((string *)&element_base_type);
                        std::allocator<char>::~allocator(&local_4b9);
                        goto LAB_0010eb57;
                      }
                      local_4c0 = local_d8._4_4_;
                      Type::Type(&local_4e0,BASE_TYPE_VECTOR64,(StructDef *)type._0_8_,
                                 (EnumDef *)type.struct_def,0);
                      type._0_8_ = local_4e0.struct_def;
                      type.struct_def = (StructDef *)local_4e0.enum_def;
                      type.enum_def._0_2_ = local_4e0.fixed_length;
                      local_d8._4_4_ = local_4c0;
                      local_d8._0_4_ = local_4e0.base_type;
                      (local_2f8->value).type.base_type = local_4e0.base_type;
                      (local_2f8->value).type.element = local_4c0;
                      (local_2f8->value).type.struct_def = local_4e0.struct_def;
                      (local_2f8->value).type.enum_def = local_4e0.enum_def;
                      (local_2f8->value).type.fixed_length = local_4e0.fixed_length;
                      local_2f8->offset64 = true;
                    }
                    pDVar2 = &local_2f8->super_Definition;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_500,"offset64",&local_501);
                    pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                        (&pDVar2->attributes,&local_500);
                    std::__cxx11::string::~string((string *)&local_500);
                    std::allocator<char>::~allocator(&local_501);
                    if (pVVar12 != (Value *)0x0) {
                      if (local_d8._0_4_ == BASE_TYPE_VECTOR64) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_528,
                                   "attribute `vector64` implies `offset64` and isn\'t required.",
                                   &local_529);
                        Warning((Parser *)struct_def,&local_528);
                        std::__cxx11::string::~string((string *)&local_528);
                        std::allocator<char>::~allocator(&local_529);
                      }
                      local_2f8->offset64 = true;
                    }
                    if ((local_2f8->offset64 & 1U) == 0) {
LAB_0010c563:
                      pDVar2 = &local_2f8->super_Definition;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_608,"key",&local_609);
                      pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                          (&pDVar2->attributes,(string *)local_608);
                      local_2f8->key = pVVar12 != (Value *)0x0;
                      std::__cxx11::string::~string((string *)local_608);
                      std::allocator<char>::~allocator(&local_609);
                      pDVar2 = &local_2f8->super_Definition;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_630,"required",&local_631);
                      pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                          (&pDVar2->attributes,(string *)local_630);
                      local_f39 = 1;
                      if (pVVar12 == (Value *)0x0) {
                        bVar5 = IsString((Type *)local_d8);
                        local_f3b = 0;
                        if (bVar5) {
                          local_f3b = local_2f8->key;
                        }
                        local_f39 = local_f3b;
                      }
                      std::__cxx11::string::~string((string *)local_630);
                      std::allocator<char>::~allocator(&local_631);
                      local_60a = local_f39 & 1;
                      bVar5 = IsString((Type *)local_d8);
                      if (bVar5) {
LAB_0010c725:
                        local_f3f = std::operator!=(&(local_2f8->value).constant,"0");
                      }
                      else {
                        bVar5 = IsVector((Type *)local_d8);
                        local_f3f = false;
                        if (bVar5) goto LAB_0010c725;
                      }
                      local_632 = local_f3f;
                      bVar5 = IsScalar(local_d8._0_4_);
                      if (bVar5) {
                        local_f43 = std::operator==(&(local_2f8->value).constant,"null");
                      }
                      else {
                        local_f44 = 1;
                        if ((local_60a & 1) == 0) {
                          local_f44 = local_632;
                        }
                        local_f43 = local_f44 ^ 0xff;
                      }
                      local_633 = local_f43 & 1;
                      if (((local_60a & 1) == 0) || ((bool)local_633 == false)) {
                        PVar7 = FieldDef::MakeFieldPresence((bool)local_633,(bool)(local_60a & 1));
                        local_2f8->presence = PVar7;
                        if ((local_60a & 1) == 0) {
LAB_0010ca2f:
                          if ((local_2f8->key & 1U) == 0) {
LAB_0010ccf8:
                            bVar5 = FieldDef::IsScalarOptional(local_2f8);
                            pSVar8 = type.struct_def;
                            if (bVar5) {
                              struct_def[5].super_Definition.attributes.vec.
                              super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                   (pointer)((ulong)struct_def[5].super_Definition.attributes.vec.
                                                                                                        
                                                  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            | 4);
                              local_73a = 0;
                              local_73b = 0;
                              bVar5 = false;
                              if (type.struct_def != (StructDef *)0x0) {
                                std::allocator<char>::allocator();
                                local_73a = 1;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_738,"null",&local_739);
                                local_73b = 1;
                                pEVar16 = EnumDef::Lookup((EnumDef *)pSVar8,&local_738);
                                bVar5 = pEVar16 != (EnumVal *)0x0;
                              }
                              if ((local_73b & 1) != 0) {
                                std::__cxx11::string::~string((string *)&local_738);
                              }
                              if ((local_73a & 1) != 0) {
                                std::allocator<char>::~allocator(&local_739);
                              }
                              if (bVar5) {
                                bVar5 = IsInteger(local_d8._0_4_);
                                if (!bVar5) {
                                  __assert_fail("IsInteger(type.base_type)",
                                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                                                ,0x480,
                                                "CheckedError flatbuffers::Parser::ParseField(StructDef &)"
                                               );
                                }
                                std::operator+(&local_780,
                                               "the default \'null\' is reserved for declaring optional scalar fields, it conflicts with declaration of enum \'"
                                               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)type.struct_def);
                                std::operator+(&local_760,&local_780,"\'.");
                                Error(this,(string *)struct_def);
                                std::__cxx11::string::~string((string *)&local_760);
                                std::__cxx11::string::~string((string *)&local_780);
                              }
                              else {
                                pDVar2 = &local_2f8->super_Definition;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_7a0,"key",&local_7a1);
                                pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                    (&pDVar2->attributes,&local_7a0);
                                std::__cxx11::string::~string((string *)&local_7a0);
                                std::allocator<char>::~allocator(&local_7a1);
                                if (pVVar12 == (Value *)0x0) {
                                  bVar5 = SupportsOptionalScalars((Parser *)struct_def);
                                  if (bVar5) goto LAB_0010d188;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_7f0,
                                             "Optional scalars are not yet supported in at least one of the specified programming languages."
                                             ,(allocator<char> *)((long)&constant + 7));
                                  Error(this,(string *)struct_def);
                                  std::__cxx11::string::~string(local_7f0);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)((long)&constant + 7));
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_7c8,
                                             "only a non-optional scalar field can be used as a \'key\' field"
                                             ,&local_7c9);
                                  Error(this,(string *)struct_def);
                                  std::__cxx11::string::~string(local_7c8);
                                  std::allocator<char>::~allocator(&local_7c9);
                                }
                              }
                            }
                            else {
LAB_0010d188:
                              if (type.struct_def == (StructDef *)0x0) {
LAB_0010d8f8:
                                if (((local_2f8->deprecated & 1U) == 0) ||
                                   ((*(byte *)(name.field_2._8_8_ + 0x110) & 1) == 0)) {
                                  pDVar2 = &local_2f8->super_Definition;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_9f8,"cpp_type",&local_9f9);
                                  pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                      (&pDVar2->attributes,&local_9f8);
                                  std::__cxx11::string::~string((string *)&local_9f8);
                                  std::allocator<char>::~allocator(&local_9f9);
                                  local_9d8 = pVVar12;
                                  if (pVVar12 != (Value *)0x0) {
                                    if (local_3c0 == (Value *)0x0) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_a20,
                                                 "cpp_type can only be used with a hashed field",
                                                 (allocator<char> *)((long)&cpp_ptr_type + 7));
                                      Error(this,(string *)struct_def);
                                      std::__cxx11::string::~string(local_a20);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)((long)&cpp_ptr_type + 7));
                                      goto LAB_0010eb57;
                                    }
                                    pDVar2 = &local_2f8->super_Definition;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_a50,"cpp_ptr_type",
                                               (allocator<char> *)((long)&val + 7));
                                    pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                        (&pDVar2->attributes,&local_a50);
                                    std::__cxx11::string::~string((string *)&local_a50);
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)((long)&val + 7));
                                    local_a30 = pVVar12;
                                    if (pVVar12 == (Value *)0x0) {
                                      pVVar12 = (Value *)operator_new(0x48);
                                      Value::Value(pVVar12);
                                      BVar3 = (local_9d8->type).base_type;
                                      BVar4 = (local_9d8->type).element;
                                      pSVar8 = (local_9d8->type).struct_def;
                                      uVar1 = *(undefined8 *)((long)&(local_9d8->type).enum_def + 2)
                                      ;
                                      *(undefined8 *)((long)&(pVVar12->type).struct_def + 2) =
                                           *(undefined8 *)((long)&(local_9d8->type).struct_def + 2);
                                      *(undefined8 *)((long)&(pVVar12->type).enum_def + 2) = uVar1;
                                      (pVVar12->type).base_type = BVar3;
                                      (pVVar12->type).element = BVar4;
                                      (pVVar12->type).struct_def = pSVar8;
                                      local_a60 = pVVar12;
                                      std::__cxx11::string::operator=
                                                ((string *)&pVVar12->constant,"naked");
                                      pDVar2 = &local_2f8->super_Definition;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_a80,"cpp_ptr_type",&local_a81);
                                      SymbolTable<flatbuffers::Value>::Add
                                                (&pDVar2->attributes,&local_a80,local_a60);
                                      std::__cxx11::string::~string((string *)&local_a80);
                                      std::allocator<char>::~allocator(&local_a81);
                                    }
                                  }
                                  pDVar2 = &local_2f8->super_Definition;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_aa8,"shared",&local_aa9);
                                  pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                      (&pDVar2->attributes,&local_aa8);
                                  local_2f8->shared = pVVar12 != (Value *)0x0;
                                  std::__cxx11::string::~string((string *)&local_aa8);
                                  std::allocator<char>::~allocator(&local_aa9);
                                  if (((local_2f8->shared & 1U) == 0) ||
                                     ((local_2f8->value).type.base_type == BASE_TYPE_STRING)) {
                                    pDVar2 = &local_2f8->super_Definition;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_b00,"native_custom_alloc",&local_b01
                                              );
                                    pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                        (&pDVar2->attributes,&local_b00);
                                    std::__cxx11::string::~string((string *)&local_b00);
                                    std::allocator<char>::~allocator(&local_b01);
                                    local_ae0 = pVVar12;
                                    if (pVVar12 == (Value *)0x0) {
                                      pDVar2 = &local_2f8->super_Definition;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_b50,"native_inline",&local_b51);
                                      pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                          (&pDVar2->attributes,&local_b50);
                                      local_2f8->native_inline = pVVar12 != (Value *)0x0;
                                      std::__cxx11::string::~string((string *)&local_b50);
                                      std::allocator<char>::~allocator(&local_b51);
                                      if (((((local_2f8->native_inline & 1U) == 0) ||
                                           (bVar5 = IsStruct(&(local_2f8->value).type), bVar5)) ||
                                          (bVar5 = IsVectorOfStruct(&(local_2f8->value).type), bVar5
                                          )) || (bVar5 = IsVectorOfTable(&(local_2f8->value).type),
                                                bVar5)) {
                                        pDVar2 = &local_2f8->super_Definition;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_ba8,"nested_flatbuffer",
                                                   &local_ba9);
                                        pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                            (&pDVar2->attributes,&local_ba8);
                                        std::__cxx11::string::~string((string *)&local_ba8);
                                        std::allocator<char>::~allocator(&local_ba9);
                                        local_b88 = pVVar12;
                                        if (pVVar12 == (Value *)0x0) {
LAB_0010e4d7:
                                          pDVar2 = &local_2f8->super_Definition;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_c20,"flexbuffer",&local_c21);
                                          pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                              (&pDVar2->attributes,&local_c20);
                                          std::__cxx11::string::~string((string *)&local_c20);
                                          std::allocator<char>::~allocator(&local_c21);
                                          if (pVVar12 != (Value *)0x0) {
                                            local_2f8->flexbuffer = true;
                                            *(undefined1 *)
                                             &struct_def[5].super_Definition.attributes.vec.
                                              super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish = 1;
                                            if ((local_d8._0_4_ != BASE_TYPE_VECTOR) ||
                                               (local_d8._4_4_ != BASE_TYPE_UCHAR)) {
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_c48,
                                                                                                                  
                                                  "flexbuffer attribute may only apply to a vector of ubyte"
                                                  ,(allocator<char> *)((long)&attr + 7));
                                              Error(this,(string *)struct_def);
                                              std::__cxx11::string::~string(local_c48);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)((long)&attr + 7));
                                              goto LAB_0010eb57;
                                            }
                                          }
                                          Expect(this,t);
                                          bVar5 = CheckedError::Check((CheckedError *)this);
                                          if (!bVar5) {
                                            CheckedError::~CheckedError((CheckedError *)this);
                                            anon_unknown_0::NoError();
                                          }
                                        }
                                        else if ((pVVar12->type).base_type == BASE_TYPE_STRING) {
                                          bVar5 = IsVector(local_d8._0_4_);
                                          if ((bVar5) && (local_d8._4_4_ == BASE_TYPE_UCHAR)) {
                                            pSVar8 = LookupCreateStruct((Parser *)struct_def,
                                                                        &local_b88->constant,true,
                                                                        false);
                                            local_2f8->nested_flatbuffer = pSVar8;
                                            goto LAB_0010e4d7;
                                          }
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_bf8,
                                                                                                          
                                                  "nested_flatbuffer attribute may only apply to a vector of ubyte"
                                                  ,&local_bf9);
                                          Error(this,(string *)struct_def);
                                          std::__cxx11::string::~string(local_bf8);
                                          std::allocator<char>::~allocator(&local_bf9);
                                        }
                                        else {
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_bd0,
                                                                                                          
                                                  "nested_flatbuffer attribute must be a string (the root type)"
                                                  ,&local_bd1);
                                          Error(this,(string *)struct_def);
                                          std::__cxx11::string::~string(local_bd0);
                                          std::allocator<char>::~allocator(&local_bd1);
                                        }
                                      }
                                      else {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_b78,
                                                                                                      
                                                  "\'native_inline\' can only be defined on structs, vector of structs or vector of tables"
                                                  ,(allocator<char> *)((long)&nested + 7));
                                        Error(this,(string *)struct_def);
                                        std::__cxx11::string::~string(local_b78);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)((long)&nested + 7));
                                      }
                                    }
                                    else {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_b28,
                                                 "native_custom_alloc can only be used with a table or struct definition"
                                                 ,&local_b29);
                                      Error(this,(string *)struct_def);
                                      std::__cxx11::string::~string(local_b28);
                                      std::allocator<char>::~allocator(&local_b29);
                                    }
                                  }
                                  else {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_ad0,"shared can only be defined on strings",
                                               (allocator<char> *)
                                               ((long)&field_native_custom_alloc + 7));
                                    Error(this,(string *)struct_def);
                                    std::__cxx11::string::~string(local_ad0);
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)
                                               ((long)&field_native_custom_alloc + 7));
                                  }
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_9c8,"can\'t deprecate fields in a struct",
                                             (allocator<char> *)((long)&cpp_type + 7));
                                  Error(this,(string *)struct_def);
                                  std::__cxx11::string::~string(local_9c8);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)((long)&cpp_type + 7));
                                }
                              }
                              else {
                                local_800 = &(local_2f8->value).constant;
                                if (local_d8._0_4_ == BASE_TYPE_UNION) {
                                  bVar5 = std::operator!=(local_800,"0");
                                  if (!bVar5) goto LAB_0010d8f8;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_820,"Union defaults must be NONE",&local_821);
                                  Error(this,(string *)struct_def);
                                  std::__cxx11::string::~string(local_820);
                                  std::allocator<char>::~allocator(&local_821);
                                }
                                else {
                                  bVar5 = IsVector((Type *)local_d8);
                                  if (bVar5) {
                                    bVar5 = std::operator!=(local_800,"0");
                                    if ((!bVar5) ||
                                       (bVar5 = std::operator!=(local_800,"[]"), !bVar5))
                                    goto LAB_0010d8f8;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_848,"Vector defaults may only be `[]`.",
                                               &local_849);
                                    Error(this,(string *)struct_def);
                                    std::__cxx11::string::~string(local_848);
                                    std::allocator<char>::~allocator(&local_849);
                                  }
                                  else {
                                    bVar5 = IsArray((Type *)local_d8);
                                    if (bVar5) {
                                      bVar5 = std::operator!=(local_800,"0");
                                      if (!bVar5) goto LAB_0010d8f8;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_870,"Array defaults are not supported yet.",
                                                 &local_871);
                                      Error(this,(string *)struct_def);
                                      std::__cxx11::string::~string(local_870);
                                      std::allocator<char>::~allocator(&local_871);
                                    }
                                    else {
                                      bVar5 = IsInteger(local_d8._0_4_);
                                      if (bVar5) {
                                        local_8c2 = 0;
                                        local_8c3 = 0;
                                        bVar6 = FieldDef::IsOptional(local_2f8);
                                        bVar5 = false;
                                        if (!bVar6) {
                                          pDVar2 = &(type.struct_def)->super_Definition;
                                          std::allocator<char>::allocator();
                                          local_8c2 = 1;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_8c0,"bit_flags",&local_8c1);
                                          local_8c3 = 1;
                                          pVVar12 = SymbolTable<flatbuffers::Value>::Lookup
                                                              (&pDVar2->attributes,&local_8c0);
                                          bVar5 = pVVar12 == (Value *)0x0;
                                        }
                                        if ((local_8c3 & 1) != 0) {
                                          std::__cxx11::string::~string((string *)&local_8c0);
                                        }
                                        if ((local_8c2 & 1) != 0) {
                                          std::allocator<char>::~allocator(&local_8c1);
                                        }
                                        if ((!bVar5) ||
                                           (pEVar16 = EnumDef::FindByValue
                                                                ((EnumDef *)type.struct_def,
                                                                 local_800),
                                           pEVar16 != (EnumVal *)0x0)) goto LAB_0010d8f8;
                                        std::operator+(&local_9a8,"default value of `",local_800);
                                        std::operator+(&local_988,&local_9a8,"` for ");
                                        std::operator+(&local_968,&local_988,"field `");
                                        std::operator+(&local_948,&local_968,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40);
                                        std::operator+(&local_928,&local_948,
                                                       "` is not part of enum `");
                                        std::operator+(&local_908,&local_928,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)type.struct_def);
                                        std::operator+(&local_8e8,&local_908,"`.");
                                        Error(this,(string *)struct_def);
                                        std::__cxx11::string::~string((string *)&local_8e8);
                                        std::__cxx11::string::~string((string *)&local_908);
                                        std::__cxx11::string::~string((string *)&local_928);
                                        std::__cxx11::string::~string((string *)&local_948);
                                        std::__cxx11::string::~string((string *)&local_968);
                                        std::__cxx11::string::~string((string *)&local_988);
                                        std::__cxx11::string::~string((string *)&local_9a8);
                                      }
                                      else {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_898,"Enums must have integer base types",
                                                   &local_899);
                                        Error(this,(string *)struct_def);
                                        std::__cxx11::string::~string(local_898);
                                        std::allocator<char>::~allocator(&local_899);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          else if ((*(byte *)(name.field_2._8_8_ + 0x113) & 1) == 0) {
                            *(undefined1 *)(name.field_2._8_8_ + 0x113) = 1;
                            bVar5 = IsScalar(local_d8._0_4_);
                            local_f6a = true;
                            if (!bVar5) {
                              bVar5 = IsString((Type *)local_d8);
                              local_f6a = true;
                              if (!bVar5) {
                                local_f6a = IsStruct((Type *)local_d8);
                              }
                            }
                            local_6aa = local_f6a;
                            bVar5 = IsArray((Type *)local_d8);
                            if (bVar5) {
                              Type::VectorType(&local_6d0,(Type *)local_d8);
                              bVar5 = IsScalar(local_6d0.base_type);
                              local_f6f = true;
                              if (!bVar5) {
                                Type::VectorType(&local_6f0,(Type *)local_d8);
                                local_f6f = IsStruct(&local_6f0);
                              }
                              local_6aa = (local_6aa & 1U) != 0 || local_f6f != false;
                            }
                            if ((local_6aa & 1U) != 0) goto LAB_0010ccf8;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_710,
                                       "\'key\' field must be string, scalar type or fixed size array of scalars"
                                       ,&local_711);
                            Error(this,(string *)struct_def);
                            std::__cxx11::string::~string(local_710);
                            std::allocator<char>::~allocator(&local_711);
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_6a8,"only one field may be set as \'key\'",&local_6a9);
                            Error(this,(string *)struct_def);
                            std::__cxx11::string::~string(local_6a8);
                            std::allocator<char>::~allocator(&local_6a9);
                          }
                        }
                        else {
                          if ((*(byte *)(name.field_2._8_8_ + 0x110) & 1) == 0) {
                            bVar5 = IsScalar(local_d8._0_4_);
                            if (!bVar5) goto LAB_0010ca2f;
                          }
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_680,
                                     "only non-scalar fields in tables may be \'required\'",
                                     &local_681);
                          Error(this,(string *)struct_def);
                          std::__cxx11::string::~string(local_680);
                          std::allocator<char>::~allocator(&local_681);
                        }
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_658,"Fields cannot be both optional and required.",
                                   &local_659);
                        Error(this,(string *)struct_def);
                        std::__cxx11::string::~string(local_658);
                        std::allocator<char>::~allocator(&local_659);
                      }
                    }
                    else {
                      bVar5 = IsString((Type *)local_d8);
                      if ((!bVar5) && (bVar5 = IsVector((Type *)local_d8), !bVar5)) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_550,
                                   "only string and vectors can have `offset64` attribute applied",
                                   &local_551);
                        Error(this,(string *)struct_def);
                        std::__cxx11::string::~string(local_550);
                        std::allocator<char>::~allocator(&local_551);
                        goto LAB_0010eb57;
                      }
                      bVar5 = IsVector((Type *)local_d8);
                      local_eea = 0;
                      if (bVar5) {
                        bVar5 = IsScalar(local_d8._4_4_);
                        if (bVar5) {
                          Type::VectorType(&local_578,(Type *)local_d8);
                          bVar5 = IsEnum(&local_578);
                          local_eed = true;
                          if (bVar5) goto LAB_0010c39d;
                        }
                        else {
LAB_0010c39d:
                          Type::VectorType(&local_598,(Type *)local_d8);
                          local_eed = IsStruct(&local_598);
                        }
                        local_eea = local_eed ^ 0xff;
                      }
                      if ((local_eea & 1) == 0) {
                        bVar5 = Supports64BitOffsets((Parser *)struct_def);
                        if (bVar5) goto LAB_0010c563;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_5e0,
                                   "fields using 64-bit offsets are not yet supported in at least one of the specified programming languages."
                                   ,&local_5e1);
                        Error(this,(string *)struct_def);
                        std::__cxx11::string::~string(local_5e0);
                        std::allocator<char>::~allocator(&local_5e1);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_5b8,"only vectors of scalars are allowed to be 64-bit.",
                                   &local_5b9);
                        Error(this,(string *)struct_def);
                        std::__cxx11::string::~string(local_5b8);
                        std::allocator<char>::~allocator(&local_5b9);
                      }
                    }
                  }
                  else {
                    bVar5 = IsVector((Type *)local_d8);
                    if (bVar5) {
                      local_e68 = local_d8._4_4_;
                    }
                    else {
                      local_e68 = local_d8._0_4_;
                    }
                    if (local_e68 - BASE_TYPE_SHORT < 2) {
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      p_Var13 = FindHashFunction16(pcVar9);
                      if (p_Var13 != (HashFunction)0x0) goto LAB_0010be5d;
                      std::operator+(&local_408,"Unknown hashing algorithm for 16 bit types: ",
                                     &local_3c0->constant);
                      Error(this,(string *)struct_def);
                      std::__cxx11::string::~string((string *)&local_408);
                    }
                    else if (local_e68 - BASE_TYPE_INT < 2) {
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      p_Var14 = FindHashFunction32(pcVar9);
                      if (p_Var14 != (HashFunction)0x0) goto LAB_0010be5d;
                      std::operator+(&local_428,"Unknown hashing algorithm for 32 bit types: ",
                                     &local_3c0->constant);
                      Error(this,(string *)struct_def);
                      std::__cxx11::string::~string((string *)&local_428);
                    }
                    else if (local_e68 - BASE_TYPE_LONG < 2) {
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      p_Var15 = FindHashFunction64(pcVar9);
                      if (p_Var15 != (HashFunction)0x0) goto LAB_0010be5d;
                      std::operator+(&local_448,"Unknown hashing algorithm for 64 bit types: ",
                                     &local_3c0->constant);
                      Error(this,(string *)struct_def);
                      std::__cxx11::string::~string((string *)&local_448);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_468,
                                 "only short, ushort, int, uint, long and ulong data types support hashing."
                                 ,&local_469);
                      Error(this,(string *)struct_def);
                      std::__cxx11::string::~string(local_468);
                      std::allocator<char>::~allocator(&local_469);
                    }
                  }
                }
              }
            }
          }
        }
        else {
          bVar5 = IsIncompleteStruct((Type *)local_d8);
          local_d7e = true;
          if (!bVar5) {
            bVar5 = IsArray((Type *)local_d8);
            local_d80 = false;
            if (bVar5) {
              Type::VectorType((Type *)((long)&type_name.field_2 + 8),(Type *)local_d8);
              local_d80 = IsIncompleteStruct((Type *)((long)&type_name.field_2 + 8));
            }
            local_d7e = local_d80;
          }
          if (local_d7e == false) {
            bVar5 = IsScalar(local_d8._0_4_);
            local_d9a = true;
            if (!bVar5) {
              local_d9a = IsStruct((Type *)local_d8);
            }
            elem_type._6_1_ = local_d9a;
            if ((local_d9a == false) && (bVar5 = IsArray((Type *)local_d8), bVar5)) {
              Type::VectorType(&local_1b0,(Type *)local_d8);
              local_190 = &local_1b0;
              bVar5 = IsScalar(local_1b0.base_type);
              local_d9e = true;
              if (!bVar5) {
                local_d9e = IsStruct(local_190);
              }
              elem_type._6_1_ = (elem_type._6_1_ & 1) != 0 || local_d9e != false;
            }
            if ((elem_type._6_1_ & 1) != 0) goto LAB_0010ac9b;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1d0,"structs may contain only scalar or struct fields",&local_1d1);
            Error(this,(string *)struct_def);
            std::__cxx11::string::~string(local_1d0);
            std::allocator<char>::~allocator(&local_1d1);
          }
          else {
            bVar5 = IsArray((Type *)local_d8);
            if (bVar5) {
              Type::VectorType(&local_140,(Type *)local_d8);
              local_d90 = local_140.struct_def;
            }
            else {
              local_d90 = (StructDef *)type._0_8_;
            }
            std::__cxx11::string::string((string *)local_120,(string *)local_d90);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_180,"Incomplete type in struct is not allowed, type name: ",
                       (allocator<char> *)((long)&elem_type + 7));
            std::operator+(&local_160,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_180,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120);
            Error(this,(string *)struct_def);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)local_180);
            std::allocator<char>::~allocator((allocator<char> *)((long)&elem_type + 7));
            std::__cxx11::string::~string((string *)local_120);
          }
        }
      }
    }
  }
LAB_0010eb57:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b0);
LAB_0010eb73:
  std::__cxx11::string::~string((string *)local_40);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseField(StructDef &struct_def) {
  std::string name = attribute_;

  if (LookupCreateStruct(name, false, false))
    return Error("field name can not be the same as table/struct name");

  if (!IsLowerSnakeCase(name)) {
    Warning("field names should be lowercase snake_case, got: " + name);
  }

  std::vector<std::string> dc = doc_comment_;
  EXPECT(kTokenIdentifier);
  EXPECT(':');
  Type type;
  ECHECK(ParseType(type));

  if (struct_def.fixed) {
    if (IsIncompleteStruct(type) ||
        (IsArray(type) && IsIncompleteStruct(type.VectorType()))) {
      std::string type_name = IsArray(type) ? type.VectorType().struct_def->name
                                            : type.struct_def->name;
      return Error(
          std::string("Incomplete type in struct is not allowed, type name: ") +
          type_name);
    }

    auto valid = IsScalar(type.base_type) || IsStruct(type);
    if (!valid && IsArray(type)) {
      const auto &elem_type = type.VectorType();
      valid |= IsScalar(elem_type.base_type) || IsStruct(elem_type);
    }
    if (!valid)
      return Error("structs may contain only scalar or struct fields");
  }

  if (!struct_def.fixed && IsArray(type))
    return Error("fixed-length array in table must be wrapped in struct");

  if (IsArray(type)) {
    advanced_features_ |= reflection::AdvancedArrayFeatures;
    if (!SupportsAdvancedArrayFeatures()) {
      return Error(
          "Arrays are not yet supported in all "
          "the specified programming languages.");
    }
  }

  FieldDef *typefield = nullptr;
  if (type.base_type == BASE_TYPE_UNION) {
    // For union fields, add a second auto-generated field to hold the type,
    // with a special suffix.

    // To ensure compatibility with many codes that rely on the BASE_TYPE_UTYPE value to identify union type fields.
    Type union_type(type.enum_def->underlying_type);
    union_type.base_type = BASE_TYPE_UTYPE;
    ECHECK(AddField(struct_def, name + UnionTypeFieldSuffix(),union_type, &typefield));
    
  } else if (IsVector(type) && type.element == BASE_TYPE_UNION) {
    advanced_features_ |= reflection::AdvancedUnionFeatures;
    // Only cpp, js and ts supports the union vector feature so far.
    if (!SupportsAdvancedUnionFeatures()) {
      return Error(
          "Vectors of unions are not yet supported in at least one of "
          "the specified programming languages.");
    }
    // For vector of union fields, add a second auto-generated vector field to
    // hold the types, with a special suffix.
    Type union_vector(BASE_TYPE_VECTOR, nullptr, type.enum_def);
    union_vector.element = BASE_TYPE_UTYPE;
    ECHECK(AddField(struct_def, name + UnionTypeFieldSuffix(), union_vector,
                    &typefield));
  }

  FieldDef *field;
  ECHECK(AddField(struct_def, name, type, &field));

  if (typefield) {
    // We preserve the relation between the typefield
    // and field, so we can easily map it in the code
    // generators.
    typefield->sibling_union_field = field;
    field->sibling_union_field = typefield;
  }

  if (token_ == '=') {
    NEXT();
    ECHECK(ParseSingleValue(&field->name, field->value, true));
    if (IsStruct(type) || (struct_def.fixed && field->value.constant != "0"))
      return Error(
          "default values are not supported for struct fields, table fields, "
          "or in structs.");
    if (IsString(type) || IsVector(type)) {
      advanced_features_ |= reflection::DefaultVectorsAndStrings;
      if (field->value.constant != "0" && !SupportsDefaultVectorsAndStrings()) {
        return Error(
            "Default values for strings and vectors are not supported in one "
            "of the specified programming languages");
      }
    }

    if (IsVector(type) && field->value.constant != "0" &&
        field->value.constant != "[]") {
      return Error("The only supported default for vectors is `[]`.");
    }
  }

  // Append .0 if the value has not it (skip hex and scientific floats).
  // This suffix needed for generated C++ code.
  if (IsFloat(type.base_type)) {
    auto &text = field->value.constant;
    FLATBUFFERS_ASSERT(false == text.empty());
    auto s = text.c_str();
    while (*s == ' ') s++;
    if (*s == '-' || *s == '+') s++;
    // 1) A float constants (nan, inf, pi, etc) is a kind of identifier.
    // 2) A float number needn't ".0" at the end if it has exponent.
    if ((false == IsIdentifierStart(*s)) &&
        (std::string::npos == field->value.constant.find_first_of(".eEpP"))) {
      field->value.constant += ".0";
    }
  }

  field->doc_comment = dc;
  ECHECK(ParseMetaData(&field->attributes));
  field->deprecated = field->attributes.Lookup("deprecated") != nullptr;
  auto hash_name = field->attributes.Lookup("hash");
  if (hash_name) {
    switch ((IsVector(type)) ? type.element : type.base_type) {
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT: {
        if (FindHashFunction16(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 16 bit types: " +
                       hash_name->constant);
        break;
      }
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT: {
        if (FindHashFunction32(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 32 bit types: " +
                       hash_name->constant);
        break;
      }
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: {
        if (FindHashFunction64(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 64 bit types: " +
                       hash_name->constant);
        break;
      }
      default:
        return Error(
            "only short, ushort, int, uint, long and ulong data types support "
            "hashing.");
    }
  }

  if (field->attributes.Lookup("vector64") != nullptr) {
    if (!IsVector(type)) {
      return Error("`vector64` attribute can only be applied on vectors.");
    }

    // Upgrade the type to be a BASE_TYPE_VECTOR64, since the attributes are
    // parsed after the type.
    const BaseType element_base_type = type.element;
    type = Type(BASE_TYPE_VECTOR64, type.struct_def, type.enum_def);
    type.element = element_base_type;

    // Since the field was already added to the parent object, update the type
    // in place.
    field->value.type = type;

    // 64-bit vectors imply the offset64 attribute.
    field->offset64 = true;
  }

  // Record that this field uses 64-bit offsets.
  if (field->attributes.Lookup("offset64") != nullptr) {
    // TODO(derekbailey): would be nice to have this be a recommendation or hint
    // instead of a warning.
    if (type.base_type == BASE_TYPE_VECTOR64) {
      Warning("attribute `vector64` implies `offset64` and isn't required.");
    }

    field->offset64 = true;
  }

  // Check for common conditions with Offset64 fields.
  if (field->offset64) {
    // TODO(derekbailey): this is where we can disable string support for
    // offset64, as that is not a hard requirement to have.
    if (!IsString(type) && !IsVector(type)) {
      return Error(
          "only string and vectors can have `offset64` attribute applied");
    }

    // If this is a Vector, only scalar and scalar-like (structs) items are
    // allowed.
    // TODO(derekbailey): allow vector of strings, just require that the strings
    // are Offset64<string>.
    if (IsVector(type) &&
        !((IsScalar(type.element) && !IsEnum(type.VectorType())) ||
          IsStruct(type.VectorType()))) {
      return Error("only vectors of scalars are allowed to be 64-bit.");
    }

    // Lastly, check if it is supported by the specified generated languages. Do
    // this last so the above checks can inform the user of schema errors to fix
    // first.
    if (!Supports64BitOffsets()) {
      return Error(
          "fields using 64-bit offsets are not yet supported in at least one "
          "of the specified programming languages.");
    }
  }

  // For historical convenience reasons, string keys are assumed required.
  // Scalars are kDefault unless otherwise specified.
  // Nonscalars are kOptional unless required;
  field->key = field->attributes.Lookup("key") != nullptr;
  const bool required = field->attributes.Lookup("required") != nullptr ||
                        (IsString(type) && field->key);
  const bool default_str_or_vec =
      ((IsString(type) || IsVector(type)) && field->value.constant != "0");
  const bool optional = IsScalar(type.base_type)
                            ? (field->value.constant == "null")
                            : !(required || default_str_or_vec);
  if (required && optional) {
    return Error("Fields cannot be both optional and required.");
  }
  field->presence = FieldDef::MakeFieldPresence(optional, required);

  if (required && (struct_def.fixed || IsScalar(type.base_type))) {
    return Error("only non-scalar fields in tables may be 'required'");
  }
  if (field->key) {
    if (struct_def.has_key) return Error("only one field may be set as 'key'");
    struct_def.has_key = true;
    auto is_valid =
        IsScalar(type.base_type) || IsString(type) || IsStruct(type);
    if (IsArray(type)) {
      is_valid |=
          IsScalar(type.VectorType().base_type) || IsStruct(type.VectorType());
    }
    if (!is_valid) {
      return Error(
          "'key' field must be string, scalar type or fixed size array of "
          "scalars");
    }
  }

  if (field->IsScalarOptional()) {
    advanced_features_ |= reflection::OptionalScalars;
    if (type.enum_def && type.enum_def->Lookup("null")) {
      FLATBUFFERS_ASSERT(IsInteger(type.base_type));
      return Error(
          "the default 'null' is reserved for declaring optional scalar "
          "fields, it conflicts with declaration of enum '" +
          type.enum_def->name + "'.");
    }
    if (field->attributes.Lookup("key")) {
      return Error(
          "only a non-optional scalar field can be used as a 'key' field");
    }
    if (!SupportsOptionalScalars()) {
      return Error(
          "Optional scalars are not yet supported in at least one of "
          "the specified programming languages.");
    }
  }

  if (type.enum_def) {
    // Verify the enum's type and default value.
    const std::string &constant = field->value.constant;
    if (type.base_type == BASE_TYPE_UNION) {
      if (constant != "0") { return Error("Union defaults must be NONE"); }
    } else if (IsVector(type)) {
      if (constant != "0" && constant != "[]") {
        return Error("Vector defaults may only be `[]`.");
      }
    } else if (IsArray(type)) {
      if (constant != "0") {
        return Error("Array defaults are not supported yet.");
      }
    } else {
      if (!IsInteger(type.base_type)) {
        return Error("Enums must have integer base types");
      }
      // Optional and bitflags enums may have default constants that are not
      // their specified variants.
      if (!field->IsOptional() &&
          type.enum_def->attributes.Lookup("bit_flags") == nullptr) {
        if (type.enum_def->FindByValue(constant) == nullptr) {
          return Error("default value of `" + constant + "` for " + "field `" +
                       name + "` is not part of enum `" + type.enum_def->name +
                       "`.");
        }
      }
    }
  }

  if (field->deprecated && struct_def.fixed)
    return Error("can't deprecate fields in a struct");

  auto cpp_type = field->attributes.Lookup("cpp_type");
  if (cpp_type) {
    if (!hash_name)
      return Error("cpp_type can only be used with a hashed field");
    /// forcing cpp_ptr_type to 'naked' if unset
    auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
    if (!cpp_ptr_type) {
      auto val = new Value();
      val->type = cpp_type->type;
      val->constant = "naked";
      field->attributes.Add("cpp_ptr_type", val);
    }
  }

  field->shared = field->attributes.Lookup("shared") != nullptr;
  if (field->shared && field->value.type.base_type != BASE_TYPE_STRING)
    return Error("shared can only be defined on strings");

  auto field_native_custom_alloc =
      field->attributes.Lookup("native_custom_alloc");
  if (field_native_custom_alloc)
    return Error(
        "native_custom_alloc can only be used with a table or struct "
        "definition");

  field->native_inline = field->attributes.Lookup("native_inline") != nullptr;
  if (field->native_inline && !IsStruct(field->value.type) &&
      !IsVectorOfStruct(field->value.type) &&
      !IsVectorOfTable(field->value.type))
    return Error(
        "'native_inline' can only be defined on structs, vector of structs or "
        "vector of tables");

  auto nested = field->attributes.Lookup("nested_flatbuffer");
  if (nested) {
    if (nested->type.base_type != BASE_TYPE_STRING)
      return Error(
          "nested_flatbuffer attribute must be a string (the root type)");
    if (!IsVector(type.base_type) || type.element != BASE_TYPE_UCHAR)
      return Error(
          "nested_flatbuffer attribute may only apply to a vector of ubyte");
    // This will cause an error if the root type of the nested flatbuffer
    // wasn't defined elsewhere.
    field->nested_flatbuffer = LookupCreateStruct(nested->constant);
  }

  if (field->attributes.Lookup("flexbuffer")) {
    field->flexbuffer = true;
    uses_flexbuffers_ = true;
    if (type.base_type != BASE_TYPE_VECTOR || type.element != BASE_TYPE_UCHAR)
      return Error("flexbuffer attribute may only apply to a vector of ubyte");
  }

  if (typefield) {
    if (!IsScalar(typefield->value.type.base_type)) {
      // this is a union vector field
      typefield->presence = field->presence;
    }
    // If this field is a union, and it has a manually assigned id,
    // the automatically added type field should have an id as well (of N - 1).
    auto attr = field->attributes.Lookup("id");
    if (attr) {
      const auto &id_str = attr->constant;
      voffset_t id = 0;
      const auto done = !atot(id_str.c_str(), *this, &id).Check();
      if (done && id > 0) {
        auto val = new Value();
        val->type = attr->type;
        val->constant = NumToString(id - 1);
        typefield->attributes.Add("id", val);
      } else {
        return Error(
            "a union type effectively adds two fields with non-negative ids, "
            "its id must be that of the second field (the first field is "
            "the type field and not explicitly declared in the schema);\n"
            "field: " +
            field->name + ", id: " + id_str);
      }
    }
    // if this field is a union that is deprecated,
    // the automatically added type field should be deprecated as well
    if (field->deprecated) { typefield->deprecated = true; }
  }

  EXPECT(';');
  return NoError();
}